

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O1

int SubsetCountNodesAux(DdNode *node,st__table *table,double max)

{
  int *piVar1;
  double *pdVar2;
  NodeData_t *pNVar3;
  double **ppdVar4;
  NodeData_t **ppNVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  DdNode *node_00;
  DdNode *node_01;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  NodeData_t *dummyN;
  NodeData_t *dummyNBar;
  NodeData_t *dummyNnv;
  NodeData_t *dummyNv;
  char *local_58;
  char *local_50;
  double local_48;
  char *local_40;
  char *local_38;
  
  if (node == (DdNode *)0x0) {
    return 0;
  }
  piVar8 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar8 == 0x7fffffff) {
    return 0;
  }
  iVar6 = st__lookup(table,(char *)node,&local_58);
  if (iVar6 != 1) {
    return 0;
  }
  if (*(long *)(local_58 + 8) != 0) {
    return 0;
  }
  uVar12 = *(ulong *)(piVar8 + 6);
  uVar9 = (ulong)((uint)node & 1);
  node_01 = (DdNode *)(uVar9 ^ *(ulong *)(piVar8 + 4));
  if (*(int *)(*(ulong *)(piVar8 + 4) & 0xfffffffffffffffe) == 0x7fffffff) {
    dVar14 = 0.0;
    if (zero != node_01) {
      dVar14 = max;
    }
  }
  else {
    iVar6 = st__lookup(table,(char *)node_01,&local_38);
    if (iVar6 != 1) {
      return 0;
    }
    dVar14 = **(double **)local_38;
  }
  node_00 = (DdNode *)(uVar9 ^ uVar12);
  if (*(int *)(uVar12 & 0xfffffffffffffffe) == 0x7fffffff) {
    dVar13 = 0.0;
    if (zero != node_00) {
      dVar13 = max;
    }
  }
  else {
    local_48 = dVar14;
    iVar6 = st__lookup(table,(char *)node_00,&local_40);
    if (iVar6 != 1) {
      return 0;
    }
    dVar13 = **(double **)local_40;
    dVar14 = local_48;
  }
  if (dVar13 <= dVar14) {
    iVar6 = SubsetCountNodesAux(node_01,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar7 = SubsetCountNodesAux(node_00,table,max);
    if (memOut != '\0') {
      return 0;
    }
    if (pageIndex == 0x800) {
      ResizeCountNodePages();
    }
    ppdVar4 = mintermPages;
    if (memOut == '\x01') {
      uVar12 = (ulong)(uint)page;
      if (-1 < page) {
        lVar10 = 0;
        do {
          pdVar2 = ppdVar4[lVar10];
          if (pdVar2 != (double *)0x0) {
            free(pdVar2);
            ppdVar4[lVar10] = (double *)0x0;
          }
          lVar10 = lVar10 + 1;
        } while (uVar12 + 1 != lVar10);
      }
      if (mintermPages != (double **)0x0) {
        free(mintermPages);
        mintermPages = (double **)0x0;
      }
      ppNVar5 = nodeDataPages;
      uVar12 = (ulong)(uint)nodeDataPage;
      if (-1 < nodeDataPage) {
        lVar10 = 0;
        do {
          pNVar3 = ppNVar5[lVar10];
          if (pNVar3 != (NodeData_t *)0x0) {
            free(pNVar3);
            ppNVar5[lVar10] = (NodeData_t *)0x0;
          }
          lVar10 = lVar10 + 1;
        } while (uVar12 + 1 != lVar10);
      }
      goto LAB_007e24eb;
    }
    piVar8 = currentLightNodePage + pageIndex;
    *piVar8 = iVar7;
  }
  else {
    iVar7 = SubsetCountNodesAux(node_00,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar6 = SubsetCountNodesAux(node_01,table,max);
    if (memOut != '\0') {
      return 0;
    }
    if (pageIndex == 0x800) {
      ResizeCountNodePages();
    }
    ppdVar4 = mintermPages;
    if (memOut == '\x01') {
      uVar12 = (ulong)(uint)page;
      if (-1 < page) {
        lVar10 = 0;
        do {
          pdVar2 = ppdVar4[lVar10];
          if (pdVar2 != (double *)0x0) {
            free(pdVar2);
            ppdVar4[lVar10] = (double *)0x0;
          }
          lVar10 = lVar10 + 1;
        } while (uVar12 + 1 != lVar10);
      }
      if (mintermPages != (double **)0x0) {
        free(mintermPages);
        mintermPages = (double **)0x0;
      }
      ppNVar5 = nodeDataPages;
      uVar12 = (ulong)(uint)nodeDataPage;
      if (-1 < nodeDataPage) {
        lVar10 = 0;
        do {
          pNVar3 = ppNVar5[lVar10];
          if (pNVar3 != (NodeData_t *)0x0) {
            free(pNVar3);
            ppNVar5[lVar10] = (NodeData_t *)0x0;
          }
          lVar10 = lVar10 + 1;
        } while (uVar12 + 1 != lVar10);
      }
      goto LAB_007e24eb;
    }
    piVar8 = currentLightNodePage + pageIndex;
    *piVar8 = iVar6;
  }
  *(int **)(local_58 + 0x10) = piVar8;
  piVar8 = currentNodePage + pageIndex;
  *piVar8 = iVar7 + 1 + iVar6;
  *(int **)(local_58 + 8) = piVar8;
  pageIndex = pageIndex + 1;
  iVar6 = st__lookup(table,(char *)((ulong)node ^ 1),&local_50);
  if (iVar6 == 1) {
    if (pageIndex == 0x800) {
      ResizeCountNodePages();
    }
    ppdVar4 = mintermPages;
    if (memOut == '\x01') {
      lVar10 = (long)page;
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          pdVar2 = ppdVar4[lVar11];
          if (pdVar2 != (double *)0x0) {
            free(pdVar2);
            ppdVar4[lVar11] = (double *)0x0;
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      if (mintermPages != (double **)0x0) {
        free(mintermPages);
        mintermPages = (double **)0x0;
      }
      ppNVar5 = nodeDataPages;
      lVar10 = (long)nodeDataPage;
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          pNVar3 = ppNVar5[lVar11];
          if (pNVar3 != (NodeData_t *)0x0) {
            free(pNVar3);
            ppNVar5[lVar11] = (NodeData_t *)0x0;
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
    }
    else {
      lVar10 = (long)pageIndex;
      piVar1 = currentLightNodePage + lVar10;
      *piVar1 = 0;
      *(int **)(local_50 + 0x10) = piVar1;
      if (lVar10 == 0x800) {
        ResizeCountNodePages();
      }
      ppdVar4 = mintermPages;
      if (memOut != '\x01') {
        piVar1 = currentNodePage + pageIndex;
        *piVar1 = 0;
        *(int **)(local_50 + 8) = piVar1;
        pageIndex = pageIndex + 1;
        goto LAB_007e253e;
      }
      lVar10 = (long)page;
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          pdVar2 = ppdVar4[lVar11];
          if (pdVar2 != (double *)0x0) {
            free(pdVar2);
            ppdVar4[lVar11] = (double *)0x0;
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      if (mintermPages != (double **)0x0) {
        free(mintermPages);
        mintermPages = (double **)0x0;
      }
      ppNVar5 = nodeDataPages;
      lVar10 = (long)nodeDataPage;
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          pNVar3 = ppNVar5[lVar11];
          if (pNVar3 != (NodeData_t *)0x0) {
            free(pNVar3);
            ppNVar5[lVar11] = (NodeData_t *)0x0;
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
    }
LAB_007e24eb:
    if (nodeDataPages != (NodeData_t **)0x0) {
      free(nodeDataPages);
      nodeDataPages = (NodeData_t **)0x0;
    }
    st__free_table(table);
    return 0;
  }
LAB_007e253e:
  return *piVar8;
}

Assistant:

static int
SubsetCountNodesAux(
  DdNode * node /* current node */,
  st__table * table /* table to update node count, also serves as visited table. */,
  double  max /* maximum number of variables */)
{
    int tval, eval, i;
    DdNode *N, *Nv, *Nnv;
    double minNv, minNnv;
    NodeData_t *dummyN, *dummyNv, *dummyNnv, *dummyNBar;
    int *pmin, *pminBar, *val;

    if ((node == NULL) || Cudd_IsConstant(node))
        return(0);

    /* if this node has been processed do nothing */
    if ( st__lookup(table, (const char *)node, (char **)&dummyN) == 1) {
        val = dummyN->nodesPointer;
        if (val != NULL)
            return(0);
    } else {
        return(0);
    }

    N  = Cudd_Regular(node);
    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* find the minterm counts for the THEN and ELSE branches */
    if (Cudd_IsConstant(Nv)) {
        if (Nv == zero) {
            minNv = 0.0;
        } else {
            minNv = max;
        }
    } else {
        if ( st__lookup(table, (const char *)Nv, (char **)&dummyNv) == 1)
            minNv = *(dummyNv->mintermPointer);
        else {
            return(0);
        }
    }
    if (Cudd_IsConstant(Nnv)) {
        if (Nnv == zero) {
            minNnv = 0.0;
        } else {
            minNnv = max;
        }
    } else {
        if ( st__lookup(table, (const char *)Nnv, (char **)&dummyNnv) == 1) {
            minNnv = *(dummyNnv->mintermPointer);
        }
        else {
            return(0);
        }
    }


    /* recur based on which has larger minterm, */
    if (minNv >= minNnv) {
        tval = SubsetCountNodesAux(Nv, table, max);
        if (memOut) return(0);
        eval = SubsetCountNodesAux(Nnv, table, max);
        if (memOut) return(0);

        /* store the node count of the lighter child. */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pmin = currentLightNodePage + pageIndex;
        *pmin = eval; /* Here the ELSE child is lighter */
        dummyN->lightChildNodesPointer = pmin;

    } else {
        eval = SubsetCountNodesAux(Nnv, table, max);
        if (memOut) return(0);
        tval = SubsetCountNodesAux(Nv, table, max);
        if (memOut) return(0);

        /* store the node count of the lighter child. */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pmin = currentLightNodePage + pageIndex;
        *pmin = tval; /* Here the THEN child is lighter */
        dummyN->lightChildNodesPointer = pmin;

    }
    /* updating the page index for node count storage. */
    pmin = currentNodePage + pageIndex;
    *pmin = tval + eval + 1;
    dummyN->nodesPointer = pmin;

    /* pageIndex is parallel page index for count_nodes and count_lightNodes */
    pageIndex++;

    /* if this node has been reached first, it belongs to a heavier
       branch. Its complement will be reached later on a lighter branch.
       Hence the complement has zero node count. */

    if ( st__lookup(table, (const char *)Cudd_Not(node), (char **)&dummyNBar) == 1)  {
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i < nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pminBar = currentLightNodePage + pageIndex;
        *pminBar = 0;
        dummyNBar->lightChildNodesPointer = pminBar;
        /* The lighter child has less nodes than the parent.
         * So if parent 0 then lighter child zero
         */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i < nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pminBar = currentNodePage + pageIndex;
        *pminBar = 0;
        dummyNBar->nodesPointer = pminBar ; /* maybe should point to zero */

        pageIndex++;
    }
    return(*pmin);
}